

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::mouseReleaseEvent(QAbstractItemView *this,QMouseEvent *event)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  State SVar4;
  uint uVar5;
  MouseButton MVar6;
  undefined4 uVar7;
  Int IVar8;
  int iVar9;
  QAbstractItemViewPrivate *event_00;
  QItemSelectionModel *pQVar10;
  QStyle *pQVar11;
  QSinglePointEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool edited;
  EditTrigger trigger;
  bool selectedClicked;
  bool click;
  bool releaseFromDoubleClick;
  QAbstractItemViewPrivate *d;
  QPersistentModelIndex index;
  QPoint pos;
  QStyleOptionViewItem option;
  QModelIndex *in_stack_fffffffffffffd78;
  QWidget *this_00;
  KeyboardModifier in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd84;
  QModelIndex *in_stack_fffffffffffffd88;
  QFlagsStorage<Qt::KeyboardModifier> lhs;
  undefined5 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd95;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  byte bVar12;
  QAbstractItemViewPrivate *index_00;
  QAbstractItemViewPrivate *this_01;
  bool local_249;
  QPersistentModelIndex local_208 [3];
  QPersistentModelIndex local_1f0 [3];
  undefined4 local_1d8;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_1d4;
  QPersistentModelIndex local_1d0 [3];
  QPersistentModelIndex local_1b8 [3];
  QPersistentModelIndex local_1a0 [3];
  QPersistentModelIndex local_188 [3];
  QPersistentModelIndex local_170 [3];
  QPersistentModelIndex local_158 [3];
  QPersistentModelIndex local_140 [3];
  QPersistentModelIndex local_128 [3];
  undefined1 local_110 [24];
  QPersistentModelIndex local_f8;
  QPointF local_f0;
  QPoint local_e0;
  undefined1 local_d8 [8];
  QFlags<QStyle::StateFlag> aQStack_d0 [50];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  event_00 = d_func((QAbstractItemView *)0x8055d5);
  bVar1 = event_00->releaseFromDoubleClick;
  event_00->releaseFromDoubleClick = false;
  local_e0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_f0 = QSinglePointEvent::position((QSinglePointEvent *)0x805610);
  local_e0 = QPointF::toPoint((QPointF *)
                              CONCAT17(in_stack_fffffffffffffd97,
                                       CONCAT16(in_stack_fffffffffffffd96,
                                                CONCAT15(in_stack_fffffffffffffd95,
                                                         in_stack_fffffffffffffd90))));
  local_f8.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RDI + 0x1f0))(local_110,in_RDI,&local_e0);
  QPersistentModelIndex::QPersistentModelIndex(&local_f8,(QModelIndex *)local_110);
  SVar4 = state((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  if (SVar4 == EditingState) {
    this_01 = event_00;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_128);
    bVar1 = QAbstractItemViewPrivate::isIndexValid
                      ((QAbstractItemViewPrivate *)
                       CONCAT17(in_stack_fffffffffffffd97,
                                CONCAT16(in_stack_fffffffffffffd96,
                                         CONCAT15(in_stack_fffffffffffffd95,
                                                  in_stack_fffffffffffffd90))),
                       in_stack_fffffffffffffd88);
    local_249 = false;
    if (bVar1) {
      index_00 = event_00;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_140);
      bVar1 = QAbstractItemViewPrivate::isIndexEnabled
                        ((QAbstractItemViewPrivate *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         in_stack_fffffffffffffd78);
      local_249 = false;
      if (bVar1) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_158);
        local_249 = QAbstractItemViewPrivate::sendDelegateEvent
                              (this_01,(QModelIndex *)index_00,(QEvent *)event_00);
      }
    }
    if (local_249 != false) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_170);
      update((QAbstractItemView *)in_stack_fffffffffffffd88,
             (QModelIndex *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    }
  }
  else {
    bVar2 = ::operator==((QPersistentModelIndex *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (QPersistentModelIndex *)in_stack_fffffffffffffd78);
    lhs.i = (Int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    bVar12 = 0;
    if (bVar2) {
      uVar5 = QPersistentModelIndex::isValid();
      bVar12 = 0;
      if ((uVar5 & 1) != 0) {
        bVar12 = bVar1 & 1U ^ 0xff;
      }
    }
    bVar12 = bVar12 & 1;
    bVar1 = false;
    if ((bVar12 != 0) && (bVar1 = false, (event_00->pressedAlreadySelected & 1U) != 0)) {
      MVar6 = QSinglePointEvent::button(in_RSI);
      bVar1 = false;
      if (MVar6 == LeftButton) {
        QInputEvent::modifiers
                  ((QInputEvent *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        bVar1 = ::operator==((QFlags<Qt::KeyboardModifier>)lhs.i,in_stack_fffffffffffffd80);
      }
    }
    uVar7 = 0;
    if (bVar1 != false) {
      uVar7 = 4;
    }
    if ((bVar12 == 0) || ((event_00->pressClosedEditor & 1U) != 0)) {
      bVar3 = 0;
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_188);
      bVar3 = (**(code **)(*in_RDI + 0x2e0))(in_RDI,local_188,uVar7,in_RSI);
    }
    event_00->ctrlDragSelectionFlag = NoUpdate;
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8058d1);
    if (((bVar1) && ((event_00->noSelectionOnMousePress & 1U) != 0)) &&
       (event_00->noSelectionOnMousePress = false, (event_00->pressClosedEditor & 1U) == 0)) {
      pQVar10 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x805917)
      ;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_1a0);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_1b8);
      uVar7 = (**(code **)(*in_RDI + 0x2e8))(in_RDI,local_1b8,in_RSI);
      (**(code **)(*(long *)pQVar10 + 0x68))(pQVar10,local_1a0,uVar7);
    }
    event_00->pressClosedEditor = false;
    setState((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (State)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    if (bVar12 != 0) {
      MVar6 = QSinglePointEvent::button(in_RSI);
      if (MVar6 == LeftButton) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_1d0);
        clicked((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                in_stack_fffffffffffffd78);
      }
      if ((bVar3 & 1) == 0) {
        memset(local_d8,0xaa,0xd0);
        QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x805a0f);
        (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
        if ((event_00->pressedAlreadySelected & 1U) != 0) {
          QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,State_Selected);
        }
        this_00 = (QWidget *)event_00->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_1f0);
        local_1d8 = (**(code **)(*(long *)this_00 + 0x138))(this_00,local_1f0);
        local_1d4.super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)
             QFlags<Qt::ItemFlag>::operator&
                       ((QFlags<Qt::ItemFlag> *)
                        CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                        (ItemFlag)((ulong)this_00 >> 0x20));
        IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1d4);
        in_stack_fffffffffffffd84 = in_stack_fffffffffffffd84 & 0xffffff;
        if (IVar8 != 0) {
          pQVar11 = QWidget::style(this_00);
          iVar9 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x3d,local_d8,in_RDI,0);
          in_stack_fffffffffffffd84 = CONCAT13(iVar9 != 0,(int3)in_stack_fffffffffffffd84);
        }
        if ((char)(in_stack_fffffffffffffd84 >> 0x18) != '\0') {
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_208);
          activated((QAbstractItemView *)
                    CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                    (QModelIndex *)this_00);
        }
        QStyleOptionViewItem::~QStyleOptionViewItem
                  ((QStyleOptionViewItem *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      }
    }
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    const bool releaseFromDoubleClick = d->releaseFromDoubleClick;
    d->releaseFromDoubleClick = false;

    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    if (state() == EditingState) {
        if (d->isIndexValid(index)
            && d->isIndexEnabled(index)
            && d->sendDelegateEvent(index, event))
            update(index);
        return;
    }

    bool click = (index == d->pressedIndex && index.isValid() && !releaseFromDoubleClick);
    bool selectedClicked = click && d->pressedAlreadySelected
                        && (event->button() == Qt::LeftButton)
                        && (event->modifiers() == Qt::NoModifier);
    EditTrigger trigger = (selectedClicked ? SelectedClicked : NoEditTriggers);
    const bool edited = click && !d->pressClosedEditor ? edit(index, trigger, event) : false;

    d->ctrlDragSelectionFlag = QItemSelectionModel::NoUpdate;

    if (d->selectionModel && d->noSelectionOnMousePress) {
        d->noSelectionOnMousePress = false;
        if (!d->pressClosedEditor)
            d->selectionModel->select(index, selectionCommand(index, event));
    }

    d->pressClosedEditor = false;
    setState(NoState);

    if (click) {
        if (event->button() == Qt::LeftButton)
            emit clicked(index);
        if (edited)
            return;
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        if (d->pressedAlreadySelected)
            option.state |= QStyle::State_Selected;
        if ((d->model->flags(index) & Qt::ItemIsEnabled)
            && style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, &option, this))
            emit activated(index);
    }
}